

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycle.c
# Opt level: O3

void free_affect(AFFECT_DATA *af)

{
  if ((af != (AFFECT_DATA *)0x0) && (af->valid == true)) {
    free_pstring(af->name);
    af->valid = false;
    af->next = affect_free;
    affect_free = af;
  }
  return;
}

Assistant:

void free_affect(AFFECT_DATA *af)
{
	if (!(af != nullptr && af->valid))
		return;

	free_pstring(af->name);

	af->valid = false;
	af->next = affect_free;
	affect_free = af;
}